

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * exprINAffinity(Parse *pParse,Expr *pExpr)

{
  Expr *pExpr_00;
  char cVar1;
  int iVar2;
  char *pcVar3;
  Expr *pExpr_01;
  Select *local_58;
  char a;
  Expr *pA;
  int i;
  char *zRet;
  Select *pSelect;
  int nVal;
  Expr *pLeft;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  pExpr_00 = pExpr->pLeft;
  iVar2 = sqlite3ExprVectorSize(pExpr_00);
  if ((pExpr->flags & 0x800) == 0) {
    local_58 = (Select *)0x0;
  }
  else {
    local_58 = (pExpr->x).pSelect;
  }
  pcVar3 = (char *)sqlite3DbMallocRaw(pParse->db,(long)(iVar2 + 1));
  if (pcVar3 != (char *)0x0) {
    for (pA._4_4_ = 0; pA._4_4_ < iVar2; pA._4_4_ = pA._4_4_ + 1) {
      pExpr_01 = sqlite3VectorFieldSubexpr(pExpr_00,pA._4_4_);
      cVar1 = sqlite3ExprAffinity(pExpr_01);
      if (local_58 == (Select *)0x0) {
        pcVar3[pA._4_4_] = cVar1;
      }
      else {
        cVar1 = sqlite3CompareAffinity(local_58->pEList->a[pA._4_4_].pExpr,cVar1);
        pcVar3[pA._4_4_] = cVar1;
      }
    }
    pcVar3[iVar2] = '\0';
  }
  return pcVar3;
}

Assistant:

static char *exprINAffinity(Parse *pParse, Expr *pExpr){
  Expr *pLeft = pExpr->pLeft;
  int nVal = sqlite3ExprVectorSize(pLeft);
  Select *pSelect = (pExpr->flags & EP_xIsSelect) ? pExpr->x.pSelect : 0;
  char *zRet;

  assert( pExpr->op==TK_IN );
  zRet = sqlite3DbMallocRaw(pParse->db, nVal+1);
  if( zRet ){
    int i;
    for(i=0; i<nVal; i++){
      Expr *pA = sqlite3VectorFieldSubexpr(pLeft, i);
      char a = sqlite3ExprAffinity(pA);
      if( pSelect ){
        zRet[i] = sqlite3CompareAffinity(pSelect->pEList->a[i].pExpr, a);
      }else{
        zRet[i] = a;
      }
    }
    zRet[nVal] = '\0';
  }
  return zRet;
}